

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.cpp
# Opt level: O3

char * nivalis::OpCode::latex_repr(uint32_t opcode)

{
  if ((int)opcode < 0x50) {
    if ((int)opcode < 0x20) {
      switch(opcode) {
      case 0:
        return "nan";
      case 1:
        return "\v";
      case 2:
        return "\r";
      case 3:
        return "$";
      case 8:
        return "@@";
      case 0xc:
        return "\t(@)";
      case 0x10:
        return "\\left\\{@:@,@\\right\\}";
      case 0x11:
        return "\\sum_{\r=@}^{@}\\left(@\\right)";
      case 0x12:
        return "\\prod_{\r=@}^{@}\\left(@\\right)";
      case 0x18:
        return "\\left\\{0:@,@\\right\\}";
      }
    }
    else if ((int)opcode < 0x31) {
      if (opcode == 0x20) {
        return "\\left(@+@\\right)";
      }
      if (opcode == 0x21) {
        return "\\left(@-@\\right)";
      }
      if (opcode == 0x30) {
        return "\\left(@\\cdot @\\right)";
      }
    }
    else if ((int)opcode < 0x40) {
      if (opcode == 0x31) {
        return "\\frac{@}{@}";
      }
      if (opcode == 0x32) {
        return "\\operatorname{mod}\\left(@, @\\right)";
      }
    }
    else {
      if (opcode == 0x40) {
        return "@^{@}";
      }
      if (opcode == 0x41) {
        return "\\log\\left(@, @\\right)";
      }
    }
  }
  else {
    switch(opcode) {
    case 0x8000:
      return "(-@)";
    case 0x8001:
      return "\\not\\left(@\\right)";
    case 0x8002:
      return "\\left|@\\right|";
    case 0x8003:
      return "\\sqrt\\left{@\\right}";
    case 0x8004:
      return "@^{2}";
    case 0x8005:
      return "\\sgn\\left(@\\right)";
    case 0x8006:
      return "\\floor\\left(@\\right)";
    case 0x8007:
      return "\\ceil\\left(@\\right)";
    case 0x8008:
      return "\\round\\left(@\\right)";
    case 0x8009:
      return "\\exp\\left(@\\right)";
    case 0x800a:
      return "2^{@}";
    case 0x800b:
      return "\\ln\\left(@\\right)";
    case 0x800c:
      return "\\log_{10}\\left(@\\right)";
    case 0x800d:
      return "\\log_{2}\\left(@\\right)";
    case 0x800e:
      return "\\fact\\left(@\\right)";
    case 0x800f:
      return "\\sin\\left(@\\right)";
    case 0x8010:
      return "\\cos\\left(@\\right)";
    case 0x8011:
      return "\\tan\\left(@\\right)";
    case 0x8012:
      return "\\arcsin\\left(@\\right)";
    case 0x8013:
      return "\\arccos\\left(@\\right)";
    case 0x8014:
      return "\\arctan\\left(@\\right)";
    case 0x8015:
      return "\\sinh\\left(@\\right)";
    case 0x8016:
      return "\\cosh\\left(@\\right)";
    case 0x8017:
      return "\\tanh\\left(@\\right)";
    case 0x8018:
      return "\\Gamma\\left(@\\right)";
    case 0x8019:
      return "\\operatorname{lgamma}\\left(@\\right)";
    case 0x801a:
      return "\\psi_{0}\\left(@\\right)";
    case 0x801b:
      return "\\psi_{1}\\left(@\\right)";
    case 0x801c:
      return "\\erf\\left(@\\right)";
    case 0x801d:
      return "\\zeta\\left(@\\right)";
    case 0x801e:
      return "\\sigmoid\\left(@\\right)";
    case 0x801f:
      return "\\softplus\\left(@\\right)";
    case 0x8020:
      return "\\gausspdf\\left(@\\right)";
    }
    switch(opcode) {
    case 0x50:
      return "\\max\\left(@, @\\right)";
    case 0x51:
      return "\\min\\left(@, @\\right)";
    case 0x52:
      return "\\left(@\\wedge @\\right)";
    case 0x53:
      return "\\left(@\\vee @\\right)";
    case 0x54:
      return "xor\\left(@, @\\right)";
    case 0x55:
    case 0x56:
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
      break;
    case 0x60:
      return "\\left(@ < @\\right)";
    case 0x61:
      return "\\left(@ \\le @\\right)";
    case 0x62:
      return "\\left(@ = @\\right)";
    case 99:
      return "\\left(@ \\ne @\\right)";
    case 100:
      return "\\left(@ \\ge @\\right)";
    case 0x65:
      return "\\left(@ > @\\right)";
    default:
      switch(opcode) {
      case 0x4000:
        return "\\gcd\\left(@,@\\right)";
      case 0x4001:
        return "\\lcm\\left(@,@\\right)";
      case 0x4002:
        return "\\choose\\left(@,@\\right)";
      case 0x4003:
        return "\\fafact\\left(@,@\\right)";
      case 0x4004:
        return "\\rifact\\left(@,@\\right)";
      case 0x4005:
        return "B\\left(@,@\\right)";
      case 0x4006:
        return "\\polygamma\\left(@,@\\right)";
      }
    }
  }
  return "";
}

Assistant:

const char* latex_repr(uint32_t opcode) {
    using namespace OpCode;
    switch (opcode) {
        case OpCode::null:  return "nan";
        case val:   return "\v";
        case ref:   return "\r";
        case sums:     return "\\sum_{\r=@}^{@}\\left(@\\right)";
        case prods:    return "\\prod_{\r=@}^{@}\\left(@\\right)";
        case bnz:   return "\\left\\{@:@,@\\right\\}";
        case bsel:  return "\\left\\{0:@,@\\right\\}";
        case add:   return "\\left(@+@\\right)";
        case sub:   return "\\left(@-@\\right)";
        case mul:   return "\\left(@\\cdot @\\right)";
        case divi:   return "\\frac{@}{@}";
        case mod:   return "\\operatorname{mod}\\left(@, @\\right)";
        case power: return "@^{@}";
        case logbase:  return "\\log\\left(@, @\\right)";
        case max:   return "\\max\\left(@, @\\right)";
        case min:   return "\\min\\left(@, @\\right)";
        case land:  return "\\left(@\\wedge @\\right)";
        case lor:   return "\\left(@\\vee @\\right)";
        case lxor:  return "xor\\left(@, @\\right)";
        case lt:    return "\\left(@ < @\\right)";
        case le:    return "\\left(@ \\le @\\right)";
        case eq:    return "\\left(@ = @\\right)";
        case ne:    return "\\left(@ \\ne @\\right)";
        case ge:    return "\\left(@ \\ge @\\right)";
        case gt:    return "\\left(@ > @\\right)";
        case gcd:   return "\\gcd\\left(@,@\\right)";
        case lcm:   return "\\lcm\\left(@,@\\right)";
        case choose:    return "\\choose\\left(@,@\\right)";
        case fafact:    return "\\fafact\\left(@,@\\right)";
        case rifact:    return "\\rifact\\left(@,@\\right)";
        case betab:      return "B\\left(@,@\\right)";
        case polygammab: return "\\polygamma\\left(@,@\\right)";
        case unaryminus:   return "(-@)";
        case lnot:     return "\\not\\left(@\\right)";
        case absb:      return "\\left|@\\right|";
        case sqrtb:     return "\\sqrt\\left{@\\right}";
        case sqrb:      return "@^{2}";
        case sgn:      return "\\sgn\\left(@\\right)";
        case floorb:    return "\\floor\\left(@\\right)";
        case ceilb:     return "\\ceil\\left(@\\right)";
        case roundb:    return "\\round\\left(@\\right)";
        case expb:      return "\\exp\\left(@\\right)";
        case exp2b:     return "2^{@}";
        case logb:      return "\\ln\\left(@\\right)";
        case log10b:    return "\\log_{10}\\left(@\\right)";
        case log2b:     return "\\log_{2}\\left(@\\right)";
        case factb:     return "\\fact\\left(@\\right)";
        case sinb:      return "\\sin\\left(@\\right)";
        case cosb:      return "\\cos\\left(@\\right)";
        case tanb:      return "\\tan\\left(@\\right)";
        case asinb:     return "\\arcsin\\left(@\\right)";
        case acosb:     return "\\arccos\\left(@\\right)";
        case atanb:     return "\\arctan\\left(@\\right)";
        case sinhb:     return "\\sinh\\left(@\\right)";
        case coshb:     return "\\cosh\\left(@\\right)";
        case tanhb:     return "\\tanh\\left(@\\right)";
        case tgammab:    return "\\Gamma\\left(@\\right)";
        case lgammab:   return "\\operatorname{lgamma}\\left(@\\right)";
        case digammab:  return "\\psi_{0}\\left(@\\right)";
        case trigammab: return "\\psi_{1}\\left(@\\right)";
        case erfb:      return "\\erf\\left(@\\right)";
        case zetab:     return "\\zeta\\left(@\\right)";
        case sigmoidb:     return "\\sigmoid\\left(@\\right)";
        case softplusb:     return "\\softplus\\left(@\\right)";
        case gausspdfb:     return "\\gausspdf\\left(@\\right)";
        case thunk_jmp: return "";
        case thunk_ret: return "@@";
        case arg: return "$";
        case call: return "\t(@)";
        default: return "";
    };
}